

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O1

ZyanStatus ZyanVectorPushBack(ZyanVector *vector,void *element)

{
  ZyanStatus ZVar1;
  ulong uVar2;
  long lVar3;
  
  ZVar1 = 0x80100004;
  if (element != (void *)0x0 && vector != (ZyanVector *)0x0) {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x1ad,"ZyanStatus ZyanVectorPushBack(ZyanVector *, const void *)");
    }
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x1ae,"ZyanStatus ZyanVectorPushBack(ZyanVector *, const void *)");
    }
    uVar2 = vector->size + 1;
    if ((vector->capacity < uVar2) &&
       (lVar3 = uVar2 * vector->growth_factor,
       ZVar1 = ZyanVectorReallocate(vector,lVar3 + (ulong)(lVar3 == 0)), (int)ZVar1 < 0)) {
      return ZVar1;
    }
    memcpy((void *)(vector->size * vector->element_size + (long)vector->data),element,
           vector->element_size);
    vector->size = vector->size + 1;
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZyanVectorPushBack(ZyanVector* vector, const void* element)
{
    if (!vector || !element)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (ZYCORE_VECTOR_SHOULD_GROW(vector->size + 1, vector->capacity))
    {
        ZYAN_CHECK(ZyanVectorReallocate(vector,
            ZYAN_MAX(1, (ZyanUSize)((vector->size + 1) * vector->growth_factor))));
    }

    void* const offset = ZYCORE_VECTOR_OFFSET(vector, vector->size);
    ZYAN_MEMCPY(offset, element, vector->element_size);

    ++vector->size;

    return ZYAN_STATUS_SUCCESS;
}